

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

void updateXdgSizeLimits(_GLFWwindow *window)

{
  wl_proxy *pwVar1;
  PFN_wl_proxy_marshal_flags p_Var2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int local_38;
  uint local_34;
  
  p_Var2 = _glfw.wl.client.proxy_marshal_flags;
  if (window->resizable == 0) {
    local_34 = (window->wl).width;
    uVar6 = (ulong)local_34;
    iVar7 = (window->wl).height;
    local_38 = iVar7;
  }
  else {
    uVar3 = window->minwidth;
    uVar6 = 0;
    iVar7 = 0;
    if ((uVar3 != 0xffffffff) && (iVar5 = window->minheight, iVar5 != -1)) {
      if ((window->wl).fallback.decorations != 0) {
        uVar3 = uVar3 + 8;
        iVar5 = iVar5 + 0x1c;
      }
      uVar6 = (ulong)uVar3;
      iVar7 = iVar5;
    }
    local_34 = window->maxwidth;
    if ((local_34 == 0xffffffff) || (local_38 = window->maxheight, local_38 == -1)) {
      local_38 = 0;
      local_34 = 0;
    }
    else if ((window->wl).fallback.decorations != 0) {
      local_34 = local_34 + 8;
      local_38 = local_38 + 0x1c;
    }
  }
  pwVar1 = (wl_proxy *)(window->wl).xdg.toplevel;
  uVar4 = (*_glfw.wl.client.proxy_get_version)(pwVar1);
  (*p_Var2)(pwVar1,8,(wl_interface *)0x0,uVar4,0,uVar6,iVar7);
  p_Var2 = _glfw.wl.client.proxy_marshal_flags;
  pwVar1 = (wl_proxy *)(window->wl).xdg.toplevel;
  uVar4 = (*_glfw.wl.client.proxy_get_version)(pwVar1);
  (*p_Var2)(pwVar1,7,(wl_interface *)0x0,uVar4,0,(ulong)local_34,local_38);
  return;
}

Assistant:

static void updateXdgSizeLimits(_GLFWwindow* window)
{
    int minwidth, minheight, maxwidth, maxheight;

    if (window->resizable)
    {
        if (window->minwidth == GLFW_DONT_CARE || window->minheight == GLFW_DONT_CARE)
            minwidth = minheight = 0;
        else
        {
            minwidth  = window->minwidth;
            minheight = window->minheight;

            if (window->wl.fallback.decorations)
            {
                minwidth  += GLFW_BORDER_SIZE * 2;
                minheight += GLFW_CAPTION_HEIGHT + GLFW_BORDER_SIZE;
            }
        }

        if (window->maxwidth == GLFW_DONT_CARE || window->maxheight == GLFW_DONT_CARE)
            maxwidth = maxheight = 0;
        else
        {
            maxwidth  = window->maxwidth;
            maxheight = window->maxheight;

            if (window->wl.fallback.decorations)
            {
                maxwidth  += GLFW_BORDER_SIZE * 2;
                maxheight += GLFW_CAPTION_HEIGHT + GLFW_BORDER_SIZE;
            }
        }
    }
    else
    {
        minwidth = maxwidth = window->wl.width;
        minheight = maxheight = window->wl.height;
    }

    xdg_toplevel_set_min_size(window->wl.xdg.toplevel, minwidth, minheight);
    xdg_toplevel_set_max_size(window->wl.xdg.toplevel, maxwidth, maxheight);
}